

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateManager.hpp
# Opt level: O2

void __thiscall
helics::InputData::InputData
          (InputData *this,string_view n_name,string_view n_type,string_view n_units)

{
  allocator<char> local_41;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  
  local_40._M_str = n_type._M_str;
  local_40._M_len = n_type._M_len;
  local_30._M_str = n_name._M_str;
  local_30._M_len = n_name._M_len;
  this->coreID = -1700000000;
  this->id = 0xffffffff;
  (this->lastData).dblock._M_len = 0;
  (this->lastData).dblock._M_str = (char *)0x0;
  (this->lastData).ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->lastData).ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->lastUpdate).internalTimeCode = 0;
  (this->lastQuery).internalTimeCode = 0;
  this->sourceIndex = 0;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&this->name,&local_30,&local_41);
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&this->type,&local_40,&local_41);
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&this->units,(basic_string_view<char,_std::char_traits<char>_> *)&n_units,
             &local_41);
  (this->pubtype)._M_dataplus._M_p = (pointer)&(this->pubtype).field_2;
  (this->pubtype)._M_string_length = 0;
  (this->pubtype).field_2._M_local_buf[0] = '\0';
  *(undefined8 *)&(this->callback).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->callback).super__Function_base._M_functor + 8) = 0;
  (this->callback).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->callback)._M_invoker = (_Invoker_type)0x0;
  this->hasUpdate = false;
  return;
}

Assistant:

InputData(std::string_view n_name, std::string_view n_type, std::string_view n_units):
        name(n_name), type(n_type), units(n_units)
    {
    }